

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  ulong uVar1;
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  Location loc_28;
  Token token_00;
  Token token_01;
  Token token_02;
  Token token_03;
  Token token_04;
  Token token_05;
  Token token_06;
  Token token_07;
  bool bVar2;
  TokenType TVar3;
  Opcode OVar4;
  Result RVar5;
  Expr *pEVar6;
  Literal *pLVar7;
  SelectExpr *this_00;
  TableCopyExpr *this_01;
  undefined **ppuVar8;
  char *pcVar9;
  Enum EVar10;
  long lVar11;
  Token *pTVar12;
  char *pcVar13;
  Expr *pEVar14;
  undefined8 in_R8;
  undefined8 in_R9;
  Var *pVVar15;
  Location *expected;
  byte bVar16;
  Location loc;
  Token token;
  allocator local_301;
  uint64_t lane_idx;
  undefined1 local_2e0 [40];
  Location loc_1;
  uint8_t values [16];
  undefined1 local_248 [48];
  Token local_218;
  Token local_1d8;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  bVar16 = 0;
  GetLocation(&loc,this);
  TVar3 = Peek(this,0);
  switch(TVar3) {
  case AtomicLoad:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_00.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_00.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_00.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_00.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_00.field_1.field_0.line = loc.field_1.field_0.line;
    loc_00.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_00.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_00.field_1._12_4_ = loc.field_1._12_4_;
    token_00.loc.filename.size_ = token.loc.filename.size_;
    token_00.loc.filename.data_ = token.loc.filename.data_;
    token_00.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_00.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_00.token_type_ = token.token_type_;
    token_00._36_4_ = token._36_4_;
    token_00.field_2.text_.data_ = token.field_2.text_.data_;
    token_00.field_2.text_.size_ = token.field_2.text_.size_;
    token_00.field_2.literal_.text.size_ = token.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_00,token_00,out_expr);
    break;
  case AtomicNotify:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_12.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_12.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_12.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_12.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_12.field_1.field_0.line = loc.field_1.field_0.line;
    loc_12.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_12.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_12.field_1._12_4_ = loc.field_1._12_4_;
    token_04.loc.filename.size_ = token.loc.filename.size_;
    token_04.loc.filename.data_ = token.loc.filename.data_;
    token_04.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_04.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_04.token_type_ = token.token_type_;
    token_04._36_4_ = token._36_4_;
    token_04.field_2.text_.data_ = token.field_2.text_.data_;
    token_04.field_2.text_.size_ = token.field_2.text_.size_;
    token_04.field_2.literal_.text.size_ = token.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_12,token_04,out_expr);
    break;
  case AtomicRmw:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_08.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_08.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_08.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_08.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_08.field_1.field_0.line = loc.field_1.field_0.line;
    loc_08.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_08.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_08.field_1._12_4_ = loc.field_1._12_4_;
    token_01.loc.filename.size_ = token.loc.filename.size_;
    token_01.loc.filename.data_ = token.loc.filename.data_;
    token_01.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_01.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_01.token_type_ = token.token_type_;
    token_01._36_4_ = token._36_4_;
    token_01.field_2.text_.data_ = token.field_2.text_.data_;
    token_01.field_2.text_.size_ = token.field_2.text_.size_;
    token_01.field_2.literal_.text.size_ = token.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_08,token_01,out_expr);
    break;
  case AtomicRmwCmpxchg:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_10.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_10.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_10.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_10.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_10.field_1.field_0.line = loc.field_1.field_0.line;
    loc_10.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_10.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_10.field_1._12_4_ = loc.field_1._12_4_;
    token_03.loc.filename.size_ = token.loc.filename.size_;
    token_03.loc.filename.data_ = token.loc.filename.data_;
    token_03.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_03.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_03.token_type_ = token.token_type_;
    token_03._36_4_ = token._36_4_;
    token_03.field_2.text_.data_ = token.field_2.text_.data_;
    token_03.field_2.text_.size_ = token.field_2.text_.size_;
    token_03.field_2.literal_.text.size_ = token.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_10,token_03,out_expr);
    break;
  case AtomicStore:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_15.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_15.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_15.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_15.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_15.field_1.field_0.line = loc.field_1.field_0.line;
    loc_15.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_15.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_15.field_1._12_4_ = loc.field_1._12_4_;
    token_05.loc.filename.size_ = token.loc.filename.size_;
    token_05.loc.filename.data_ = token.loc.filename.data_;
    token_05.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_05.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_05.token_type_ = token.token_type_;
    token_05._36_4_ = token._36_4_;
    token_05.field_2.text_.data_ = token.field_2.text_.data_;
    token_05.field_2.text_.size_ = token.field_2.text_.size_;
    token_05.field_2.literal_.text.size_ = token.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_15,token_05,out_expr);
    break;
  case AtomicWait:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_17.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_17.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_17.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_17.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_17.field_1.field_0.line = loc.field_1.field_0.line;
    loc_17.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_17.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_17.field_1._12_4_ = loc.field_1._12_4_;
    token_06.loc.filename.size_ = token.loc.filename.size_;
    token_06.loc.filename.data_ = token.loc.filename.data_;
    token_06.loc.field_1.field_1.offset = token.loc.field_1.field_1.offset;
    token_06.loc.field_1._8_8_ = token.loc.field_1._8_8_;
    token_06.token_type_ = token.token_type_;
    token_06._36_4_ = token._36_4_;
    token_06.field_2.text_.data_ = token.field_2.text_.data_;
    token_06.field_2.text_.size_ = token.field_2.text_.size_;
    token_06.field_2.literal_.text.size_ = token.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                      (this,loc_17,token_06,out_expr);
    break;
  case Binary:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Binary;
    ppuVar8 = &PTR__Expr_001c0a40;
    goto LAB_0016cc59;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                  ,0x837,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&token,this);
    loc_16.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_16.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_16.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_16.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_16.field_1.field_0.line = loc.field_1.field_0.line;
    loc_16.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_16.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_16.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>(this,loc_16,out_expr);
    break;
  case BrIf:
    Consume(&token,this);
    loc_07.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_07.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_07.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_07.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_07.field_1.field_0.line = loc.field_1.field_0.line;
    loc_07.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_07.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_07.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>(this,loc_07,out_expr);
    break;
  case BrOnExn:
    Consume(&token,this);
    MakeUnique<wabt::BrOnExnExpr,wabt::Location&>((wabt *)&token,&loc);
    RVar5 = ParseVar(this,(Var *)(token.loc.filename.data_ + 0x40));
    if (RVar5.enum_ != Error) {
      RVar5 = ParseVar(this,(Var *)(token.loc.filename.data_ + 0x88));
LAB_0016c42e:
      if (RVar5.enum_ != Error) goto LAB_0016d10e;
    }
    goto LAB_0016c437;
  case BrTable:
    Consume(&token,this);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>((wabt *)&token,&loc);
    RVar5 = ParseVarList(this,(VarVector *)(token.loc.filename.data_ + 0x40));
    if (RVar5.enum_ != Error) {
      Var::operator=((Var *)(token.loc.filename.data_ + 0x58),
                     (Var *)(*(long *)(token.loc.filename.data_ + 0x48) + -0x48));
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::pop_back
                ((vector<wabt::Var,_std::allocator<wabt::Var>_> *)(token.loc.filename.data_ + 0x40))
      ;
      pcVar9 = token.loc.filename.data_;
      token.loc.filename.data_ = (char *)0x0;
      pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
               _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
               super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
      (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
      super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
      super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pcVar9;
      if (pEVar6 == (Expr *)0x0) goto LAB_0016d1f2;
      (*pEVar6->_vptr_Expr[1])();
    }
    if (token.loc.filename.data_ != (char *)0x0) {
      (**(code **)(*(long *)token.loc.filename.data_ + 8))();
    }
    break;
  case Call:
    Consume(&token,this);
    loc_04.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_04.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_04.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_04.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_04.field_1.field_0.line = loc.field_1.field_0.line;
    loc_04.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_04.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_04.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>(this,loc_04,out_expr);
    break;
  case CallIndirect:
    Consume(&token,this);
    MakeUnique<wabt::CallIndirectExpr,wabt::Location&>((wabt *)&token,&loc);
    pVVar15 = (Var *)(token.loc.filename.data_ + 0xc0);
    Var::Var(&local_78,0,&loc);
    ParseVarOpt(this,pVVar15,&local_78);
    Var::~Var(&local_78);
    RVar5 = ParseTypeUseOpt(this,(FuncDeclaration *)(token.loc.filename.data_ + 0x40));
    if (RVar5.enum_ != Error) {
      RVar5 = ParseUnboundFuncSignature(this,(FuncSignature *)(token.loc.filename.data_ + 0x90));
      goto LAB_0016c42e;
    }
LAB_0016c437:
    if (token.loc.filename.data_ != (char *)0x0) {
      (**(code **)(*(long *)token.loc.filename.data_ + 8))();
    }
    goto LAB_0016d08b;
  case Compare:
    pEVar6 = (Expr *)operator_new(0x40);
    Consume(&token,this);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Compare;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001c0a90;
    *(Enum *)&pEVar6->field_0x3c = OVar4.enum_;
    pEVar14 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
    goto LAB_0016cec4;
  case Const:
    Const::Const((Const *)&token);
    RVar5 = ParseConst(this,(Const *)&token,Normal);
    if (RVar5.enum_ != Error) {
      pEVar6 = (Expr *)operator_new(0x88);
      (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (pEVar6->loc).filename.data_ =
           (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
      (pEVar6->loc).filename.size_ =
           CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_);
      (pEVar6->loc).field_1.field_1.offset =
           CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
      *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
           CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
      pEVar6->type_ = Const;
      pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001bfc30;
      pTVar12 = &token;
      pEVar14 = pEVar6 + 1;
      for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
        pEVar14->_vptr_Expr = (_func_int **)(pTVar12->loc).filename.data_;
        pTVar12 = (Token *)((long)pTVar12 + (ulong)bVar16 * -0x10 + 8);
        pEVar14 = (Expr *)((long)pEVar14 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      goto LAB_0016cebe;
    }
    goto LAB_0016d08b;
  case Convert:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Convert;
    ppuVar8 = &PTR__Expr_001c0ae0;
    goto LAB_0016cc59;
  case DataDrop:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_11.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_11.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_11.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_11.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_11.field_1.field_0.line = loc.field_1.field_0.line;
    loc_11.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_11.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_11.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>(this,loc_11,out_expr);
    break;
  case Drop:
    Consume(&token,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Drop;
    ppuVar8 = &PTR__Expr_001c04d0;
    goto LAB_0016cebb;
  case ElemDrop:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_20.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_20.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_20.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_20.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_20.field_1.field_0.line = loc.field_1.field_0.line;
    loc_20.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_20.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_20.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)46>>(this,loc_20,out_expr);
    break;
  case GlobalGet:
    Consume(&token,this);
    loc_06.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_06.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_06.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_06.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_06.field_1.field_0.line = loc.field_1.field_0.line;
    loc_06.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_06.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_06.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>(this,loc_06,out_expr);
    break;
  case GlobalSet:
    Consume(&token,this);
    loc_05.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_05.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_05.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_05.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_05.field_1.field_0.line = loc.field_1.field_0.line;
    loc_05.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_05.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_05.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)19>>(this,loc_05,out_expr);
    break;
  case Load:
    Consume(&local_1d8,this);
    loc_09.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_09.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_09.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_09.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_09.field_1.field_0.line = loc.field_1.field_0.line;
    loc_09.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_09.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_09.field_1._12_4_ = loc.field_1._12_4_;
    token_02.loc.filename.size_ = local_1d8.loc.filename.size_;
    token_02.loc.filename.data_ = local_1d8.loc.filename.data_;
    token_02.loc.field_1.field_1.offset = local_1d8.loc.field_1.field_1.offset;
    token_02.loc.field_1._8_8_ = local_1d8.loc.field_1._8_8_;
    token_02.token_type_ = local_1d8.token_type_;
    token_02._36_4_ = local_1d8._36_4_;
    token_02.field_2.text_.data_ = local_1d8.field_2.text_.data_;
    token_02.field_2.text_.size_ = local_1d8.field_2.text_.size_;
    token_02.field_2.literal_.text.size_ = local_1d8.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                      (this,loc_09,token_02,out_expr);
    break;
  case LocalGet:
    Consume(&token,this);
    loc_22.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_22.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_22.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_22.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_22.field_1.field_0.line = loc.field_1.field_0.line;
    loc_22.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_22.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_22.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)22>>(this,loc_22,out_expr);
    break;
  case LocalSet:
    Consume(&token,this);
    loc_02.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_02.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_02.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_02.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_02.field_1.field_0.line = loc.field_1.field_0.line;
    loc_02.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_02.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_02.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)23>>(this,loc_02,out_expr);
    break;
  case LocalTee:
    Consume(&token,this);
    loc_21.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_21.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_21.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_21.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_21.field_1.field_0.line = loc.field_1.field_0.line;
    loc_21.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_21.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_21.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>(this,loc_21,out_expr);
    break;
  case MemoryCopy:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = MemoryCopy;
    ppuVar8 = &PTR__Expr_001c0b30;
    goto LAB_0016cebb;
  case MemoryFill:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = MemoryFill;
    ppuVar8 = &PTR__Expr_001c0b68;
    goto LAB_0016cebb;
  case MemoryGrow:
    Consume(&token,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = MemoryGrow;
    ppuVar8 = &PTR__Expr_001c0c78;
    goto LAB_0016cebb;
  case MemoryInit:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_18.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_18.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_18.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_18.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_18.field_1.field_0.line = loc.field_1.field_0.line;
    loc_18.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_18.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_18.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)30>>(this,loc_18,out_expr);
    break;
  case MemorySize:
    Consume(&token,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = MemorySize;
    ppuVar8 = &PTR__Expr_001c0c40;
    goto LAB_0016cebb;
  case Nop:
    Consume(&token,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Nop;
    ppuVar8 = &PTR__Expr_001c0498;
    goto LAB_0016cebb;
  case RefFunc:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_14.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_14.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_14.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_14.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_14.field_1.field_0.line = loc.field_1.field_0.line;
    loc_14.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_14.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_14.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)34>>(this,loc_14,out_expr);
    break;
  case RefIsNull:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = RefIsNull;
    ppuVar8 = &PTR__Expr_001c0f18;
    goto LAB_0016cebb;
  case RefNull:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = RefNull;
    ppuVar8 = &PTR__Expr_001c0ee0;
    goto LAB_0016cebb;
  case Rethrow:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Rethrow;
    ppuVar8 = &PTR__Expr_001c0fa0;
    goto LAB_0016cebb;
  case ReturnCallIndirect:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>((wabt *)&token,&loc);
    RVar5 = ParseTypeUseOpt(this,(FuncDeclaration *)(token.loc.filename.data_ + 0x40));
    if ((RVar5.enum_ == Error) ||
       (RVar5 = ParseUnboundFuncSignature(this,(FuncSignature *)(token.loc.filename.data_ + 0x90)),
       RVar5.enum_ == Error)) goto LAB_0016c437;
    pVVar15 = (Var *)(token.loc.filename.data_ + 0xc0);
    Var::Var(&local_c0,0,&loc);
    ParseVarOpt(this,pVVar15,&local_c0);
    Var::~Var(&local_c0);
LAB_0016d10e:
    pcVar9 = token.loc.filename.data_;
    token.loc.filename.data_ = (char *)0x0;
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)pcVar9;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
      pEVar14 = (Expr *)token.loc.filename.data_;
      goto LAB_0016cec4;
    }
    goto LAB_0016d1f2;
  case ReturnCall:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_03.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_03.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_03.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_03.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_03.field_1.field_0.line = loc.field_1.field_0.line;
    loc_03.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_03.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_03.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)38>>(this,loc_03,out_expr);
    break;
  case Return:
    Consume(&token,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Return;
    ppuVar8 = &PTR__Expr_001c0648;
    goto LAB_0016cebb;
  case Select:
    Consume(&token,this);
    token.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    token.loc.filename.data_ = (char *)0x0;
    token.loc.filename.size_ = 0;
    if (((this->options_->features).reference_types_enabled_ == true) &&
       (bVar2 = MatchLpar(this,Result), bVar2)) {
      RVar5 = ParseValueTypeList(this,(TypeVector *)&token);
      if ((RVar5.enum_ == Error) || (RVar5 = Expect(this,Rpar), RVar5.enum_ == Error)) {
        std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
                  ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&token);
        goto LAB_0016d08b;
      }
    }
    else {
      lane_idx._0_4_ = 0;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::emplace_back<wabt::Type>
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)&token,(Type *)&lane_idx);
    }
    this_00 = (SelectExpr *)operator_new(0x58);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_248 + 0x18),
               (vector<wabt::Type,_std::allocator<wabt::Type>_> *)&token);
    SelectExpr::SelectExpr
              (this_00,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)(local_248 + 0x18),&loc);
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_00;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)(local_248 + 0x18));
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&token);
    goto LAB_0016d1f2;
  case SimdLaneOp:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    bVar2 = PeekMatch(this,Last_Literal);
    if ((!bVar2) && (bVar2 = PeekMatch(this,Int), !bVar2)) {
      std::__cxx11::string::string((string *)&lane_idx,"a natural number",(allocator *)local_248);
      expected = &loc_1;
      loc_1.filename.data_ = (char *)0x0;
      loc_1.filename.size_ = 0;
      loc_1.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)expected,
                 (string *)&lane_idx,local_2e0);
      pcVar9 = "123";
LAB_0016d345:
      RVar5 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)expected,pcVar9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)expected);
      std::__cxx11::string::_M_dispose();
      return (Result)RVar5.enum_;
    }
    Consume((Token *)&lane_idx,this);
    pLVar7 = Token::literal((Token *)&lane_idx);
    pcVar9 = (pLVar7->text).data_;
    uVar1 = (pLVar7->text).size_;
    RVar5 = ParseInt64(pcVar9,pcVar9 + uVar1,&lane_idx,SignedAndUnsigned);
    if (RVar5.enum_ == Error) {
      pcVar13 = "invalid literal \"%.*s\"";
LAB_0016d221:
      loc_27.filename.data_._4_4_ = loc.filename.data_._4_4_;
      loc_27.filename.data_._0_4_ = loc.filename.data_._0_4_;
      loc_27.filename.size_._0_4_ = (undefined4)loc.filename.size_;
      loc_27.filename.size_._4_4_ = loc.filename.size_._4_4_;
      loc_27.field_1.field_0.line = loc.field_1.field_0.line;
      loc_27.field_1.field_0.first_column = loc.field_1.field_0.first_column;
      loc_27.field_1.field_0.last_column = loc.field_1.field_0.last_column;
      loc_27.field_1._12_4_ = loc.field_1._12_4_;
      Error(this,loc_27,pcVar13,uVar1 & 0xffffffff,pcVar9,in_R8,in_R9);
      return (Result)Error;
    }
    if (0xff < CONCAT44(lane_idx._4_4_,(uint)lane_idx)) {
      pcVar13 = "lane index \"%.*s\" out-of-range [0, 32)";
      goto LAB_0016d221;
    }
    pEVar6 = (Expr *)operator_new(0x48);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    pEVar6->type_ = SimdLaneOp;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001bfd20;
    *(Enum *)&pEVar6->field_0x3c = OVar4.enum_;
    pEVar6[1]._vptr_Expr = (_func_int **)CONCAT44(lane_idx._4_4_,(uint)lane_idx);
    goto LAB_0016cc60;
  case SimdShuffleOp:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
      GetLocation(&loc_1,this);
      bVar2 = PeekMatch(this,Last_Literal);
      if (!bVar2) {
        std::__cxx11::string::string
                  ((string *)&lane_idx,"a natural number in range [0, 32)",&local_301);
        expected = (Location *)local_248;
        local_248._0_8_ = (char *)0x0;
        local_248._8_8_ = 0;
        local_248._16_8_ = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)expected,
                   (string *)&lane_idx,local_2e0);
        pcVar9 = (char *)0x0;
        goto LAB_0016d345;
      }
      Consume((Token *)&lane_idx,this);
      pLVar7 = Token::literal((Token *)&lane_idx);
      pcVar9 = (pLVar7->text).data_;
      uVar1 = (pLVar7->text).size_;
      lane_idx._0_4_ = 0;
      RVar5 = ParseInt32(pcVar9,pcVar9 + uVar1,(uint32_t *)&lane_idx,UnsignedOnly);
      if (RVar5.enum_ == Error) {
        pcVar13 = "invalid literal \"%.*s\"";
LAB_0016d371:
        loc_28.filename.size_._0_4_ = (undefined4)loc_1.filename.size_;
        loc_28.filename.data_ = loc_1.filename.data_;
        loc_28.filename.size_._4_4_ = loc_1.filename.size_._4_4_;
        loc_28.field_1.field_0.line = loc_1.field_1.field_0.line;
        loc_28.field_1.field_0.first_column = loc_1.field_1.field_0.first_column;
        loc_28.field_1.field_0.last_column = loc_1.field_1.field_0.last_column;
        loc_28.field_1._12_4_ = loc_1.field_1._12_4_;
        Error(this,loc_28,pcVar13,uVar1 & 0xffffffff,pcVar9,in_R8,in_R9);
        goto LAB_0016d08b;
      }
      if (0xff < (uint)lane_idx) {
        pcVar13 = "shuffle index \"%.*s\" out-of-range [0, 32)";
        goto LAB_0016d371;
      }
      values[lVar11] = (uint8_t)(uint)lane_idx;
    }
    pEVar6 = (Expr *)operator_new(0x50);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = SimdShuffleOp;
    pEVar6->_vptr_Expr = (_func_int **)&PTR__Expr_001bfd70;
    *(Enum *)&pEVar6->field_0x3c = OVar4.enum_;
    pEVar6[1]._vptr_Expr = (_func_int **)values._0_8_;
    pEVar6[1].super_intrusive_list_base<wabt::Expr>.next_ = (Expr *)values._8_8_;
    goto LAB_0016cc60;
  case Store:
    Consume(&local_218,this);
    loc_25.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_25.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_25.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_25.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_25.field_1.field_0.line = loc.field_1.field_0.line;
    loc_25.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_25.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_25.field_1._12_4_ = loc.field_1._12_4_;
    token_07.loc.filename.size_ = local_218.loc.filename.size_;
    token_07.loc.filename.data_ = local_218.loc.filename.data_;
    token_07.loc.field_1.field_1.offset = local_218.loc.field_1.field_1.offset;
    token_07.loc.field_1._8_8_ = local_218.loc.field_1._8_8_;
    token_07.token_type_ = local_218.token_type_;
    token_07._36_4_ = local_218._36_4_;
    token_07.field_2.text_.data_ = local_218.field_2.text_.data_;
    token_07.field_2.text_.size_ = local_218.field_2.text_.size_;
    token_07.field_2.literal_.text.size_ = local_218.field_2.literal_.text.size_;
    RVar5 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)44>>
                      (this,loc_25,token_07,out_expr);
    break;
  case TableCopy:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    Var::Var((Var *)&token,0,&loc);
    Var::Var((Var *)&lane_idx,0,&loc);
    if ((this->options_->features).reference_types_enabled_ == true) {
      Var::Var(&local_108,(Var *)&token);
      ParseVarOpt(this,(Var *)&token,&local_108);
      Var::~Var(&local_108);
      Var::Var(&local_150,(Var *)&lane_idx);
      ParseVarOpt(this,(Var *)&lane_idx,&local_150);
      Var::~Var(&local_150);
    }
    this_01 = (TableCopyExpr *)operator_new(0xd0);
    TableCopyExpr::TableCopyExpr(this_01,(Var *)&token,(Var *)&lane_idx,&loc);
    goto LAB_0016d1c7;
  case TableFill:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_13.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_13.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_13.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_13.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_13.field_1.field_0.line = loc.field_1.field_0.line;
    loc_13.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_13.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_13.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)52>>(this,loc_13,out_expr);
    break;
  case TableGet:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_24.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_24.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_24.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_24.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_24.field_1.field_0.line = loc.field_1.field_0.line;
    loc_24.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_24.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_24.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)48>>(this,loc_24,out_expr);
    break;
  case TableGrow:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_01.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_01.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_01.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_01.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_01.field_1.field_0.line = loc.field_1.field_0.line;
    loc_01.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_01.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_01.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)49>>(this,loc_01,out_expr);
    break;
  case TableInit:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    Var::Var((Var *)&token,0,&loc);
    RVar5 = ParseVar(this,(Var *)&token);
    if (RVar5.enum_ == Error) {
      Var::~Var((Var *)&token);
      goto LAB_0016d08b;
    }
    Var::Var((Var *)&lane_idx,0,&loc);
    Var::Var(&local_198,(Var *)&lane_idx);
    bVar2 = ParseVarOpt(this,(Var *)&lane_idx,&local_198);
    Var::~Var(&local_198);
    if (bVar2) {
      std::swap<wabt::Var>((Var *)&token,(Var *)&lane_idx);
    }
    this_01 = (TableCopyExpr *)operator_new(0xd0);
    TableInitExpr::TableInitExpr((TableInitExpr *)this_01,(Var *)&token,(Var *)&lane_idx,&loc);
LAB_0016d1c7:
    pEVar6 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
             _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
             super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = (Expr *)this_01;
    if (pEVar6 != (Expr *)0x0) {
      (*pEVar6->_vptr_Expr[1])();
    }
    Var::~Var((Var *)&lane_idx);
    Var::~Var((Var *)&token);
    goto LAB_0016d1f2;
  case TableSet:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_23.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_23.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_23.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_23.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_23.field_1.field_0.line = loc.field_1.field_0.line;
    loc_23.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_23.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_23.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)51>>(this,loc_23,out_expr);
    break;
  case TableSize:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_26.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_26.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_26.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_26.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_26.field_1.field_0.line = loc.field_1.field_0.line;
    loc_26.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_26.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_26.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)50>>(this,loc_26,out_expr);
    break;
  case Ternary:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Ternary;
    ppuVar8 = &PTR__Expr_001c11b8;
    goto LAB_0016cc59;
  case Throw:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    loc_19.filename.data_._4_4_ = loc.filename.data_._4_4_;
    loc_19.filename.data_._0_4_ = loc.filename.data_._0_4_;
    loc_19.filename.size_._0_4_ = (undefined4)loc.filename.size_;
    loc_19.filename.size_._4_4_ = loc.filename.size_._4_4_;
    loc_19.field_1.field_0.line = loc.field_1.field_0.line;
    loc_19.field_1.field_0.first_column = loc.field_1.field_0.first_column;
    loc_19.field_1.field_0.last_column = loc.field_1.field_0.last_column;
    loc_19.field_1._12_4_ = loc.field_1._12_4_;
    RVar5 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)54>>(this,loc_19,out_expr);
    break;
  case Unary:
    Consume(&token,this);
    ErrorUnlessOpcodeEnabled(this,&token);
    pEVar6 = (Expr *)operator_new(0x40);
    OVar4 = Token::opcode(&token);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Unary;
    ppuVar8 = &PTR__Expr_001c09f0;
LAB_0016cc59:
    pEVar6->_vptr_Expr = (_func_int **)ppuVar8;
    *(Enum *)&pEVar6->field_0x3c = OVar4.enum_;
LAB_0016cc60:
    pEVar14 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
    goto LAB_0016cec4;
  case Last_Opcode:
    Consume(&token,this);
    pEVar6 = (Expr *)operator_new(0x40);
    (pEVar6->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
    (pEVar6->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
    (pEVar6->loc).filename.data_ =
         (char *)CONCAT44(loc.filename.data_._4_4_,loc.filename.data_._0_4_);
    (pEVar6->loc).filename.size_ = CONCAT44(loc.filename.size_._4_4_,(undefined4)loc.filename.size_)
    ;
    (pEVar6->loc).field_1.field_1.offset =
         CONCAT44(loc.field_1.field_0.first_column,loc.field_1.field_0.line);
    *(ulong *)((long)&(pEVar6->loc).field_1 + 8) =
         CONCAT44(loc.field_1._12_4_,loc.field_1.field_0.last_column);
    pEVar6->type_ = Last;
    ppuVar8 = &PTR__Expr_001c0460;
LAB_0016cebb:
    pEVar6->_vptr_Expr = (_func_int **)ppuVar8;
LAB_0016cebe:
    pEVar14 = (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>.
              _M_t.super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
              super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl;
    (out_expr->_M_t).super___uniq_ptr_impl<wabt::Expr,_std::default_delete<wabt::Expr>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Expr_*,_std::default_delete<wabt::Expr>_>.
    super__Head_base<0UL,_wabt::Expr_*,_false>._M_head_impl = pEVar6;
LAB_0016cec4:
    if (pEVar14 != (Expr *)0x0) {
      (*pEVar14->_vptr_Expr[1])();
    }
    goto LAB_0016d1f2;
  }
  if (RVar5.enum_ == Error) {
LAB_0016d08b:
    EVar10 = Error;
  }
  else {
LAB_0016d1f2:
    EVar10 = Ok;
  }
  return (Result)EVar10;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select: {
      Consume();
      TypeVector result;
      if (options_->features.reference_types_enabled() &&
          MatchLpar(TokenType::Result)) {
        CHECK_RESULT(ParseValueTypeList(&result));
        EXPECT(Rpar);
      } else {
        result.push_back(Type::Any);
      }
      out_expr->reset(new SelectExpr(result, loc));
      break;
    }

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrOnExn: {
      Consume();
      auto expr = MakeUnique<BrOnExnExpr>(loc);
      CHECK_RESULT(ParseVar(&expr->label_var));
      CHECK_RESULT(ParseVar(&expr->event_var));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      ParseVarOpt(&expr->table, Var(0, loc));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::LocalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalGetExpr>(loc, out_expr));
      break;

    case TokenType::LocalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalSetExpr>(loc, out_expr));
      break;

    case TokenType::LocalTee:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalTeeExpr>(loc, out_expr));
      break;

    case TokenType::GlobalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalGetExpr>(loc, out_expr));
      break;

    case TokenType::GlobalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalSetExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_, ConstType::Normal));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new BinaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::DataDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<DataDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var dst(0, loc);
      Var src(0, loc);
      if (options_->features.reference_types_enabled()) {
        ParseVarOpt(&dst, dst);
        ParseVarOpt(&src, src);
      }
      out_expr->reset(new TableCopyExpr(dst, src, loc));
      break;
    }

    case TokenType::ElemDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ElemDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var segment_index(0, loc);
      CHECK_RESULT(ParseVar(&segment_index));
      Var table_index(0, loc);
      if (ParseVarOpt(&table_index, table_index)) {
        // Here are the two forms:
        //
        //   table.init $elemidx ...
        //   table.init $tableidx $elemidx ...
        //
        // So if both indexes are provided, we need to swap them.
        std::swap(segment_index, table_index);
      }
      out_expr->reset(new TableInitExpr(segment_index, table_index, loc));
      break;
    }

    case TokenType::TableGet:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableGetExpr>(loc, out_expr));
      break;

    case TokenType::TableSet:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSetExpr>(loc, out_expr));
      break;

    case TokenType::TableGrow:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableSize:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSizeExpr>(loc, out_expr));
      break;

    case TokenType::TableFill:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableFillExpr>(loc, out_expr));
      break;

    case TokenType::RefFunc:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RefFuncExpr>(loc, out_expr));
      break;

    case TokenType::RefNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefNullExpr(loc));
      break;

    case TokenType::RefIsNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefIsNullExpr(loc));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicNotify: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicNotifyExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      if (!PeekMatch(TokenType::Nat) && !PeekMatch(TokenType::Int)) {
        return ErrorExpected({"a natural number"}, "123");
      }

      Literal literal = Consume().literal();
      uint64_t lane_idx;

      // TODO: The simd tests currently allow a lane number with an optional +,
      // but probably shouldn't. See
      // https://github.com/WebAssembly/simd/issues/181#issuecomment-597386919
      Result result = ParseInt64(literal.text.begin(), literal.text.end(),
                                 &lane_idx, ParseIntType::SignedAndUnsigned);

      if (Failed(result)) {
        Error(loc, "invalid literal \"" PRIstringview "\"",
              WABT_PRINTF_STRING_VIEW_ARG(literal.text));
        return Result::Error;
      }

      // TODO: Should share lane validation logic w/ SimdShuffleOp below. (See
      // comment below for explanation of 255 vs. 32)
      if (lane_idx > 255) {
        Error(loc, "lane index \"" PRIstringview "\" out-of-range [0, 32)",
              WABT_PRINTF_STRING_VIEW_ARG(literal.text));
        return Result::Error;
      }
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint8_t values[16];
      for (int lane = 0; lane < 16; ++lane) {
        Location loc = GetLocation();

        if (!PeekMatch(TokenType::Nat)) {
          return ErrorExpected({"a natural number in range [0, 32)"});
        }

        Literal literal = Consume().literal();

        string_view sv = literal.text;
        const char* s = sv.begin();
        const char* end = sv.end();
        Result result;

        uint32_t value = 0;
        result = ParseInt32(s, end, &value, ParseIntType::UnsignedOnly);

        if (Failed(result)) {
          Error(loc, "invalid literal \"" PRIstringview "\"",
                WABT_PRINTF_STRING_VIEW_ARG(literal.text));
          return Result::Error;
        }

        // The valid range is only [0, 32), but it's only malformed if it can't
        // fit in a byte.
        if (value > 255) {
          Error(loc,
                "shuffle index \"" PRIstringview "\" out-of-range [0, 32)",
                WABT_PRINTF_STRING_VIEW_ARG(literal.text));
          return Result::Error;
        }

        values[lane] = static_cast<uint8_t>(value);
      }
      v128 value = Bitcast<v128>(values);

      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), value, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}